

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

void __thiscall libtorrent::http_parser::~http_parser(http_parser *this)

{
  http_parser *this_local;
  
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
            (&this->m_chunked_ranges);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap(&this->m_header);
  std::__cxx11::string::~string((string *)&this->m_server_message);
  std::__cxx11::string::~string((string *)&this->m_protocol);
  std::__cxx11::string::~string((string *)&this->m_path);
  std::__cxx11::string::~string((string *)&this->m_method);
  return;
}

Assistant:

http_parser::~http_parser() = default;